

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

float get_long_short_ratio_x(void)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Object local_18;
  int local_c;
  int max_short_x;
  int max_long_x;
  
  pAVar2 = (Am_Value *)Am_Object::Get(0x33e8,0x66);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get(0x3428,0x66);
  local_c = Am_Value::operator_cast_to_int(pAVar2);
  local_c = iVar1 - local_c;
  Am_Object::Get_Object((ushort)&local_18,0x1133d8);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x182);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::~Am_Object(&local_18);
  return (float)local_c / (float)iVar1;
}

Assistant:

float
get_long_short_ratio_x()
{
  int max_long_x =
      (int)(SP_Long_Win.Get(Am_WIDTH)) - (int)(SP_Long_Feed.Get(Am_WIDTH));
  int max_short_x = SP_Scroll_Agg.Get_Object(Am_H_SCROLLER).Get(Am_VALUE_2);
  return ((float)max_long_x / max_short_x);
}